

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O3

void print(bool **arr,string *s)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar3 = (ulong)(uint)bsize;
  if (0 < bsize) {
    lVar5 = 1;
    do {
      if (0 < (int)uVar3) {
        lVar4 = 0;
        do {
          std::ostream::_M_insert<bool>(true);
          lVar4 = lVar4 + 1;
        } while (lVar4 < bsize);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      uVar3 = (ulong)bsize;
      bVar1 = lVar5 < (long)uVar3;
      lVar5 = lVar5 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void print(bool **arr, const string &s) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << arr[i][j];
        }
        cout << endl;
    }
}